

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigFilter.cpp
# Opt level: O3

bool __thiscall eglu::FilterList::match(FilterList *this,ConfigInfo *configInfo)

{
  undefined8 *puVar1;
  char cVar2;
  undefined8 *puVar3;
  undefined4 local_38 [2];
  ConfigInfo *local_30;
  
  local_38[0] = 1;
  puVar1 = *(undefined8 **)this;
  local_30 = configInfo;
  if (puVar1 == *(undefined8 **)(this + 8)) {
    cVar2 = true;
  }
  else {
    do {
      puVar3 = puVar1 + 1;
      cVar2 = (*(code *)*puVar1)(local_38);
      if (cVar2 == '\0') {
        return false;
      }
      puVar1 = puVar3;
    } while (puVar3 != *(undefined8 **)(this + 8));
  }
  return (bool)cVar2;
}

Assistant:

CandidateConfig::CandidateConfig (const ConfigInfo& configInfo)
	: m_type(TYPE_CONFIG_INFO)
{
	m_cfg.configInfo = &configInfo;
}